

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec3 __thiscall djb::microfacet::u2_to_h2(microfacet *this,vec2 *u,vec3 *wi,args *args)

{
  float fVar1;
  undefined8 extraout_XMM0_Qa;
  float fVar2;
  float fVar3;
  vec3 vVar4;
  vec3 local_40;
  vec3 local_30;
  
  local_40 = djb::operator*(&args->minv,wi);
  local_30 = normalize(&local_40);
  fVar3 = local_30.z;
  (*(this->super_brdf)._vptr_brdf[0xc])(this,u);
  fVar1 = (float)extraout_XMM0_Qa;
  fVar2 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  local_40.y = (args->minv).r[2].y * fVar3 +
               (args->minv).r[0].y * fVar1 + (args->minv).r[1].y * fVar2;
  local_40.x = (args->minv).r[2].x * fVar3 +
               (args->minv).r[0].x * fVar1 + (args->minv).r[1].x * fVar2;
  local_40.z = fVar3 * (args->minv).r[2].z +
               (args->minv).r[0].z * fVar1 + fVar2 * (args->minv).r[1].z;
  vVar4 = normalize(&local_40);
  return vVar4;
}

Assistant:

vec3
microfacet::u2_to_h2(const vec2 &u, const vec3 &wi, const args &args) const
{
	vec3 wi_std = normalize(args.minv * wi);
	vec3 wm_std = u2_to_h2_std(u, wi_std);
	vec3 wm = normalize(transpose(args.minv) * wm_std);

	return wm;
}